

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_loader.cpp
# Opt level: O0

void __thiscall spvtools::opt::IrLoader::EndModule(IrLoader *this)

{
  Module *pMVar1;
  bool bVar2;
  pointer this_00;
  reference this_01;
  reference this_02;
  value_type *bb;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  value_type *function;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_18;
  IrLoader *local_10;
  IrLoader *this_local;
  
  local_10 = this;
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->block_);
  if ((bVar2) &&
     (bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->function_), bVar2)) {
    this_00 = std::
              unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
              operator->(&this->function_);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    unique_ptr(&local_18,&this->block_);
    Function::AddBasicBlock(this_00,&local_18);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr(&local_18);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    operator=(&this->block_,(nullptr_t)0x0);
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->function_);
  if (bVar2) {
    pMVar1 = this->module_;
    std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
    unique_ptr((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> *
               )&__range2,&this->function_);
    Module::AddFunction(pMVar1,(unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                *)&__range2);
    std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 *)&__range2);
    std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
    operator=(&this->function_,(nullptr_t)0x0);
  }
  pMVar1 = this->module_;
  join_0x00000010_0x00000000_ = Module::begin(pMVar1);
  _function = Module::end(pMVar1);
  while (bVar2 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                           ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                            (UptrVectorIterator<spvtools::opt::Function,_false> *)&function), bVar2)
  {
    this_01 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    join_0x00000010_0x00000000_ = Function::begin(this_01);
    _bb = Function::end(this_01);
    while (bVar2 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                              &__end3.iterator_,
                              (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&bb), bVar2) {
      this_02 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                          ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_
                          );
      BasicBlock::SetParent(this_02,this_01);
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_);
    }
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  Module::SetTrailingDbgLineInfo(this->module_,&this->dbg_line_info_);
  return;
}

Assistant:

void IrLoader::EndModule() {
  if (block_ && function_) {
    // We're in the middle of a basic block, but the terminator is missing.
    // Register the block anyway.  This lets us write tests with less
    // boilerplate.
    function_->AddBasicBlock(std::move(block_));
    block_ = nullptr;
  }
  if (function_) {
    // We're in the middle of a function, but the OpFunctionEnd is missing.
    // Register the function anyway.  This lets us write tests with less
    // boilerplate.
    module_->AddFunction(std::move(function_));
    function_ = nullptr;
  }
  for (auto& function : *module_) {
    for (auto& bb : function) bb.SetParent(&function);
  }

  // Copy any trailing Op*Line instruction into the module
  module_->SetTrailingDbgLineInfo(std::move(dbg_line_info_));
}